

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearWindowSettings(char *name)

{
  ImGuiWindow *pIVar1;
  ImGuiWindowSettings *pIVar2;
  char *in_RDI;
  ImGuiWindowSettings *in_stack_00000008;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiWindow *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  ImGuiID id;
  
  id = (ImGuiID)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  pIVar1 = FindWindowByName(in_stack_ffffffffffffffe0);
  if (pIVar1 == (ImGuiWindow *)0x0) {
    ImHashStr(in_RDI,0,0);
    pIVar2 = FindWindowSettingsByID(id);
  }
  else {
    pIVar1->Flags = pIVar1->Flags | 0x100;
    InitOrLoadWindowSettings((ImGuiWindow *)settings,in_stack_00000008);
    pIVar2 = FindWindowSettingsByWindow(in_stack_ffffffffffffffd8);
  }
  if (pIVar2 != (ImGuiWindowSettings *)0x0) {
    pIVar2->WantDelete = true;
  }
  return;
}

Assistant:

void ImGui::ClearWindowSettings(const char* name)
{
    //IMGUI_DEBUG_LOG("ClearWindowSettings('%s')\n", name);
    ImGuiWindow* window = FindWindowByName(name);
    if (window != NULL)
    {
        window->Flags |= ImGuiWindowFlags_NoSavedSettings;
        InitOrLoadWindowSettings(window, NULL);
    }
    if (ImGuiWindowSettings* settings = window ? FindWindowSettingsByWindow(window) : FindWindowSettingsByID(ImHashStr(name)))
        settings->WantDelete = true;
}